

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Gia_ManCorrPerformRemapping(Vec_Int_t *vPairs,Vec_Ptr_t *vInfo)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  if (1 < vInfo->nSize) {
    iVar10 = vPairs->nSize;
    if (0 < iVar10) {
      ppvVar3 = vInfo->pArray;
      piVar4 = vPairs->pArray;
      uVar7 = (uint)((ulong)((long)ppvVar3[1] - (long)*ppvVar3) >> 2);
      uVar9 = 0;
      do {
        if ((long)iVar10 <= (long)(uVar9 | 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = piVar4[uVar9 | 1];
        if (((long)iVar1 < 0) || (vInfo->nSize <= iVar1)) goto LAB_005cf18f;
        uVar2 = piVar4[uVar9];
        if (((int)uVar2 < 0) || ((uint)vInfo->nSize <= uVar2)) goto LAB_005cf18f;
        if (0 < (int)uVar7) {
          pvVar5 = ppvVar3[iVar1];
          pvVar6 = ppvVar3[uVar2];
          uVar8 = 0;
          do {
            if (*(int *)((long)pvVar5 + uVar8 * 4) != 0) {
              __assert_fail("pInfoObj[w] == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                            ,0x197,"void Gia_ManCorrPerformRemapping(Vec_Int_t *, Vec_Ptr_t *)");
            }
            *(undefined4 *)((long)pvVar5 + uVar8 * 4) = *(undefined4 *)((long)pvVar6 + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar8);
          iVar10 = vPairs->nSize;
        }
        uVar9 = uVar9 + 2;
      } while ((int)uVar9 < iVar10);
    }
    return;
  }
LAB_005cf18f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ManCorrPerformRemapping( Vec_Int_t * vPairs, Vec_Ptr_t * vInfo )
{
    unsigned * pInfoObj, * pInfoRepr;
    int w, i, iObj, iRepr, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Vec_IntForEachEntry( vPairs, iRepr, i )
    {
        iObj = Vec_IntEntry( vPairs, ++i );
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, iObj );
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, iRepr );
        for ( w = 0; w < nWords; w++ )
        {
            assert( pInfoObj[w] == 0 );
            pInfoObj[w] = pInfoRepr[w];
        }
    }
}